

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

bool BmsUtil::wchar_to_utf8(wchar_t *org,char *out,int maxlen)

{
  size_t sVar1;
  size_t sStack_50;
  int r;
  size_t len_out;
  size_t len_in;
  char *but_out_iconv;
  ICONVCHR *buf_iconv;
  iconv_t cd;
  char *pcStack_20;
  int maxlen_local;
  char *out_local;
  wchar_t *org_local;
  
  cd._4_4_ = maxlen;
  pcStack_20 = out;
  out_local = (char *)org;
  buf_iconv = (ICONVCHR *)iconv_open("UTF-8","UTF-16LE");
  if (buf_iconv == (ICONVCHR *)0xffffffffffffffff) {
    org_local._7_1_ = false;
  }
  else {
    *pcStack_20 = '\0';
    but_out_iconv = out_local;
    len_in = (size_t)pcStack_20;
    sVar1 = wcslen((wchar_t *)out_local);
    len_out = sVar1 << 1;
    sStack_50 = (size_t)cd._4_4_;
    sVar1 = iconv(buf_iconv,&but_out_iconv,&len_out,(char **)&len_in,&stack0xffffffffffffffb0);
    if ((int)sVar1 == -1) {
      org_local._7_1_ = false;
    }
    else {
      *(undefined1 *)len_in = 0;
      org_local._7_1_ = true;
    }
  }
  return org_local._7_1_;
}

Assistant:

bool BmsUtil::wchar_to_utf8(const wchar_t *org, char *out, int maxlen)
{
	//
	// should not use convert_to_utf8()
	// because WCHAR is a little different from UTF8 (\0 bytes included)
	//
	iconv_t cd = iconv_open("UTF-8", "UTF-16LE");
	if (cd == (void*)-1)
		return false;

	out[0] = 0;
	ICONVCHR *buf_iconv = (ICONVCHR*)org;
	char *but_out_iconv = (char*)out;
	size_t len_in = wcslen(org) * 2;
	size_t len_out = maxlen;

	int r = iconv(cd, &buf_iconv, &len_in, &but_out_iconv, &len_out);
	if ((int)r == -1)
		return false;
	*but_out_iconv = 0;

	return true;
}